

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

ImageFormat __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::TranslateImageFormat
          (TGlslangToSpvTraverser *this,TType *type)

{
  int iVar1;
  TLayoutFormat TVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  iVar1 = (*type->_vptr_TType[7])();
  if (iVar1 != 0xe) {
    __assert_fail("type.getBasicType() == glslang::EbtSampler",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x484,
                  "spv::ImageFormat (anonymous namespace)::TGlslangToSpvTraverser::TranslateImageFormat(const glslang::TType &)"
                 );
  }
  iVar1 = (*type->_vptr_TType[0xb])();
  TVar2 = glslang::TQualifier::getFormat((TQualifier *)CONCAT44(extraout_var,iVar1));
  if ((TVar2 - ElfRg32f < 0xf) || (TVar2 - ElfRg32i < 5)) {
LAB_005c7cdc:
    spv::Builder::addCapability(&this->builder,CapabilityStorageImageExtendedFormats);
  }
  else {
    if (TVar2 != ElfR64i) {
      if (TVar2 - ElfRg32ui < 6) goto LAB_005c7cdc;
      if (TVar2 != ElfR64ui) goto LAB_005c7d1a;
    }
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_image_int64");
    spv::Builder::addCapability(&this->builder,CapabilityInt64ImageEXT);
  }
LAB_005c7d1a:
  iVar1 = (*type->_vptr_TType[0xb])();
  TVar2 = glslang::TQualifier::getFormat((TQualifier *)CONCAT44(extraout_var_00,iVar1));
  switch(TVar2) {
  case ElfNone:
    this_local._4_4_ = ImageFormatUnknown;
    break;
  case ElfRgba32f:
    this_local._4_4_ = ImageFormatRgba32f;
    break;
  case ElfRgba16f:
    this_local._4_4_ = ImageFormatRgba16f;
    break;
  case ElfR32f:
    this_local._4_4_ = ImageFormatR32f;
    break;
  case ElfRgba8:
    this_local._4_4_ = ImageFormatRgba8;
    break;
  case ElfRgba8Snorm:
    this_local._4_4_ = ImageFormatRgba8Snorm;
    break;
  default:
    this_local._4_4_ = ImageFormatMax;
    break;
  case ElfRg32f:
    this_local._4_4_ = ImageFormatRg32f;
    break;
  case ElfRg16f:
    this_local._4_4_ = ImageFormatRg16f;
    break;
  case ElfR11fG11fB10f:
    this_local._4_4_ = ImageFormatR11fG11fB10f;
    break;
  case ElfR16f:
    this_local._4_4_ = ImageFormatR16f;
    break;
  case ElfRgba16:
    this_local._4_4_ = ImageFormatRgba16;
    break;
  case ElfRgb10A2:
    this_local._4_4_ = ImageFormatRgb10A2;
    break;
  case ElfRg16:
    this_local._4_4_ = ImageFormatRg16;
    break;
  case ElfRg8:
    this_local._4_4_ = ImageFormatRg8;
    break;
  case ElfR16:
    this_local._4_4_ = ImageFormatR16;
    break;
  case ElfR8:
    this_local._4_4_ = ImageFormatR8;
    break;
  case ElfRgba16Snorm:
    this_local._4_4_ = ImageFormatRgba16Snorm;
    break;
  case ElfRg16Snorm:
    this_local._4_4_ = ImageFormatRg16Snorm;
    break;
  case ElfRg8Snorm:
    this_local._4_4_ = ImageFormatRg8Snorm;
    break;
  case ElfR16Snorm:
    this_local._4_4_ = ImageFormatR16Snorm;
    break;
  case ElfR8Snorm:
    this_local._4_4_ = ImageFormatR8Snorm;
    break;
  case ElfRgba32i:
    this_local._4_4_ = ImageFormatRgba32i;
    break;
  case ElfRgba16i:
    this_local._4_4_ = ImageFormatRgba16i;
    break;
  case ElfRgba8i:
    this_local._4_4_ = ImageFormatRgba8i;
    break;
  case ElfR32i:
    this_local._4_4_ = ImageFormatR32i;
    break;
  case ElfRg32i:
    this_local._4_4_ = ImageFormatRg32i;
    break;
  case ElfRg16i:
    this_local._4_4_ = ImageFormatRg16i;
    break;
  case ElfRg8i:
    this_local._4_4_ = ImageFormatRg8i;
    break;
  case ElfR16i:
    this_local._4_4_ = ImageFormatR16i;
    break;
  case ElfR8i:
    this_local._4_4_ = ImageFormatR8i;
    break;
  case ElfR64i:
    this_local._4_4_ = ImageFormatR64i;
    break;
  case ElfRgba32ui:
    this_local._4_4_ = ImageFormatRgba32ui;
    break;
  case ElfRgba16ui:
    this_local._4_4_ = ImageFormatRgba16ui;
    break;
  case ElfRgba8ui:
    this_local._4_4_ = ImageFormatRgba8ui;
    break;
  case ElfR32ui:
    this_local._4_4_ = ImageFormatR32ui;
    break;
  case ElfRg32ui:
    this_local._4_4_ = ImageFormatRg32ui;
    break;
  case ElfRg16ui:
    this_local._4_4_ = ImageFormatRg16ui;
    break;
  case ElfRgb10a2ui:
    this_local._4_4_ = ImageFormatRgb10a2ui;
    break;
  case ElfRg8ui:
    this_local._4_4_ = ImageFormatRg8ui;
    break;
  case ElfR16ui:
    this_local._4_4_ = ImageFormatR16ui;
    break;
  case ElfR8ui:
    this_local._4_4_ = ImageFormatR8ui;
    break;
  case ElfR64ui:
    this_local._4_4_ = ImageFormatR64ui;
  }
  return this_local._4_4_;
}

Assistant:

spv::ImageFormat TGlslangToSpvTraverser::TranslateImageFormat(const glslang::TType& type)
{
    assert(type.getBasicType() == glslang::EbtSampler);

    // Check for capabilities
    switch (type.getQualifier().getFormat()) {
    case glslang::ElfRg32f:
    case glslang::ElfRg16f:
    case glslang::ElfR11fG11fB10f:
    case glslang::ElfR16f:
    case glslang::ElfRgba16:
    case glslang::ElfRgb10A2:
    case glslang::ElfRg16:
    case glslang::ElfRg8:
    case glslang::ElfR16:
    case glslang::ElfR8:
    case glslang::ElfRgba16Snorm:
    case glslang::ElfRg16Snorm:
    case glslang::ElfRg8Snorm:
    case glslang::ElfR16Snorm:
    case glslang::ElfR8Snorm:

    case glslang::ElfRg32i:
    case glslang::ElfRg16i:
    case glslang::ElfRg8i:
    case glslang::ElfR16i:
    case glslang::ElfR8i:

    case glslang::ElfRgb10a2ui:
    case glslang::ElfRg32ui:
    case glslang::ElfRg16ui:
    case glslang::ElfRg8ui:
    case glslang::ElfR16ui:
    case glslang::ElfR8ui:
        builder.addCapability(spv::CapabilityStorageImageExtendedFormats);
        break;

    case glslang::ElfR64ui:
    case glslang::ElfR64i:
        builder.addExtension(spv::E_SPV_EXT_shader_image_int64);
        builder.addCapability(spv::CapabilityInt64ImageEXT);
        break;
    default:
        break;
    }

    // do the translation
    switch (type.getQualifier().getFormat()) {
    case glslang::ElfNone:          return spv::ImageFormatUnknown;
    case glslang::ElfRgba32f:       return spv::ImageFormatRgba32f;
    case glslang::ElfRgba16f:       return spv::ImageFormatRgba16f;
    case glslang::ElfR32f:          return spv::ImageFormatR32f;
    case glslang::ElfRgba8:         return spv::ImageFormatRgba8;
    case glslang::ElfRgba8Snorm:    return spv::ImageFormatRgba8Snorm;
    case glslang::ElfRg32f:         return spv::ImageFormatRg32f;
    case glslang::ElfRg16f:         return spv::ImageFormatRg16f;
    case glslang::ElfR11fG11fB10f:  return spv::ImageFormatR11fG11fB10f;
    case glslang::ElfR16f:          return spv::ImageFormatR16f;
    case glslang::ElfRgba16:        return spv::ImageFormatRgba16;
    case glslang::ElfRgb10A2:       return spv::ImageFormatRgb10A2;
    case glslang::ElfRg16:          return spv::ImageFormatRg16;
    case glslang::ElfRg8:           return spv::ImageFormatRg8;
    case glslang::ElfR16:           return spv::ImageFormatR16;
    case glslang::ElfR8:            return spv::ImageFormatR8;
    case glslang::ElfRgba16Snorm:   return spv::ImageFormatRgba16Snorm;
    case glslang::ElfRg16Snorm:     return spv::ImageFormatRg16Snorm;
    case glslang::ElfRg8Snorm:      return spv::ImageFormatRg8Snorm;
    case glslang::ElfR16Snorm:      return spv::ImageFormatR16Snorm;
    case glslang::ElfR8Snorm:       return spv::ImageFormatR8Snorm;
    case glslang::ElfRgba32i:       return spv::ImageFormatRgba32i;
    case glslang::ElfRgba16i:       return spv::ImageFormatRgba16i;
    case glslang::ElfRgba8i:        return spv::ImageFormatRgba8i;
    case glslang::ElfR32i:          return spv::ImageFormatR32i;
    case glslang::ElfRg32i:         return spv::ImageFormatRg32i;
    case glslang::ElfRg16i:         return spv::ImageFormatRg16i;
    case glslang::ElfRg8i:          return spv::ImageFormatRg8i;
    case glslang::ElfR16i:          return spv::ImageFormatR16i;
    case glslang::ElfR8i:           return spv::ImageFormatR8i;
    case glslang::ElfRgba32ui:      return spv::ImageFormatRgba32ui;
    case glslang::ElfRgba16ui:      return spv::ImageFormatRgba16ui;
    case glslang::ElfRgba8ui:       return spv::ImageFormatRgba8ui;
    case glslang::ElfR32ui:         return spv::ImageFormatR32ui;
    case glslang::ElfRg32ui:        return spv::ImageFormatRg32ui;
    case glslang::ElfRg16ui:        return spv::ImageFormatRg16ui;
    case glslang::ElfRgb10a2ui:     return spv::ImageFormatRgb10a2ui;
    case glslang::ElfRg8ui:         return spv::ImageFormatRg8ui;
    case glslang::ElfR16ui:         return spv::ImageFormatR16ui;
    case glslang::ElfR8ui:          return spv::ImageFormatR8ui;
    case glslang::ElfR64ui:         return spv::ImageFormatR64ui;
    case glslang::ElfR64i:          return spv::ImageFormatR64i;
    default:                        return spv::ImageFormatMax;
    }
}